

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.cpp
# Opt level: O1

void __thiscall
Refal2::CErrorsHelper::RaiseError(CErrorsHelper *this,TErrorSeverity severity,string *message)

{
  if (severity != ES_None) {
    (this->super_CError).severity = severity;
    (this->super_CError).userMessage._M_string_length = 0;
    *(this->super_CError).userMessage._M_dataplus._M_p = '\0';
    CError::SetMessage(&this->super_CError,message);
    raiseError(this);
    (this->super_CError).severity = ES_None;
    (this->super_CError).userMessage._M_string_length = 0;
    *(this->super_CError).userMessage._M_dataplus._M_p = '\0';
    (this->super_CError).message._M_string_length = 0;
    *(this->super_CError).message._M_dataplus._M_p = '\0';
    (this->super_CError).userMessage._M_string_length = 0;
    *(this->super_CError).userMessage._M_dataplus._M_p = '\0';
    return;
  }
  __assert_fail("_severity != ES_None",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Errors.cpp"
                ,0x1d,"void Refal2::CError::SetSeverity(TErrorSeverity)");
}

Assistant:

void CError::SetSeverity( TErrorSeverity _severity )
{
	assert( _severity != ES_None );
	severity = _severity;
	resetCache();
}